

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserInputPtr
xmlCtxtNewInputFromFd
          (xmlParserCtxtPtr ctxt,char *url,int fd,char *encoding,xmlParserInputFlags flags)

{
  xmlParserInputPtr input;
  
  if (-1 < fd && ctxt != (xmlParserCtxtPtr)0x0) {
    input = xmlNewInputFromFd(url,fd,(uint)ctxt->options >> 0x15 & XML_INPUT_UNZIP | flags);
    if (input != (xmlParserInputPtr)0x0) {
      if (encoding == (char *)0x0) {
        return input;
      }
      xmlSwitchInputEncodingName(ctxt,input,encoding);
      return input;
    }
    xmlCtxtErrMemory(ctxt);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromFd(xmlParserCtxtPtr ctxt, const char *url,
                      int fd, const char *encoding,
                      xmlParserInputFlags flags) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (fd < 0))
	return(NULL);

    if (ctxt->options & XML_PARSE_UNZIP)
        flags |= XML_INPUT_UNZIP;

    input = xmlNewInputFromFd(url, fd, flags);
    if (input == NULL) {
	xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}